

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int iVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  Scene *pSVar62;
  ulong uVar63;
  ulong *puVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_e78;
  RTCFilterFunctionNArguments local_cd0;
  Scene *local_ca0;
  undefined1 auStack_c98 [24];
  long local_c80;
  undefined1 auStack_c78 [24];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined4 uStack_bc4;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar105._4_4_ = uVar1;
  auVar105._0_4_ = uVar1;
  auVar105._8_4_ = uVar1;
  auVar105._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar109._4_4_ = uVar1;
  auVar109._0_4_ = uVar1;
  auVar109._8_4_ = uVar1;
  auVar109._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar113._4_4_ = uVar1;
  auVar113._0_4_ = uVar1;
  auVar113._8_4_ = uVar1;
  auVar113._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar31 = fVar2 * 0.99999964;
  fVar32 = fVar3 * 0.99999964;
  fVar33 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar57 = (tray->tnear).field_0.i[k];
  auVar86._4_4_ = iVar57;
  auVar86._0_4_ = iVar57;
  auVar86._8_4_ = iVar57;
  auVar86._12_4_ = iVar57;
  iVar57 = (tray->tfar).field_0.i[k];
  auVar91._4_4_ = iVar57;
  auVar91._0_4_ = iVar57;
  auVar91._8_4_ = iVar57;
  auVar91._12_4_ = iVar57;
  local_bc0._16_16_ = mm_lookupmask_ps._240_16_;
  local_bc0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar57 = 1 << ((uint)k & 0x1f);
  auVar69._4_4_ = iVar57;
  auVar69._0_4_ = iVar57;
  auVar69._8_4_ = iVar57;
  auVar69._12_4_ = iVar57;
  auVar69._16_4_ = iVar57;
  auVar69._20_4_ = iVar57;
  auVar69._24_4_ = iVar57;
  auVar69._28_4_ = iVar57;
  auVar70 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar69 = vpand_avx2(auVar69,auVar70);
  local_c00 = vpcmpeqd_avx2(auVar69,auVar70);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar76._16_4_ = 0x3f800000;
  auVar76._20_4_ = 0x3f800000;
  auVar76._24_4_ = 0x3f800000;
  auVar76._28_4_ = 0x3f800000;
  auVar70._8_4_ = 0xbf800000;
  auVar70._0_8_ = 0xbf800000bf800000;
  auVar70._12_4_ = 0xbf800000;
  auVar70._16_4_ = 0xbf800000;
  auVar70._20_4_ = 0xbf800000;
  auVar70._24_4_ = 0xbf800000;
  auVar70._28_4_ = 0xbf800000;
  _local_be0 = vblendvps_avx(auVar76,auVar70,local_bc0);
  local_e78 = local_7f8;
LAB_01605aba:
  do {
    puVar64 = local_e78;
    if (puVar64 == &local_800) {
LAB_016065d2:
      return puVar64 != &local_800;
    }
    local_e78 = puVar64 + -1;
    uVar61 = puVar64[-1];
    while ((uVar61 & 8) == 0) {
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar65),auVar105);
      auVar68._0_4_ = fVar31 * auVar34._0_4_;
      auVar68._4_4_ = fVar31 * auVar34._4_4_;
      auVar68._8_4_ = fVar31 * auVar34._8_4_;
      auVar68._12_4_ = fVar31 * auVar34._12_4_;
      auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar67),auVar109);
      auVar73._0_4_ = fVar32 * auVar34._0_4_;
      auVar73._4_4_ = fVar32 * auVar34._4_4_;
      auVar73._8_4_ = fVar32 * auVar34._8_4_;
      auVar73._12_4_ = fVar32 * auVar34._12_4_;
      auVar34 = vmaxps_avx(auVar68,auVar73);
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar66),auVar113);
      auVar74._0_4_ = fVar33 * auVar68._0_4_;
      auVar74._4_4_ = fVar33 * auVar68._4_4_;
      auVar74._8_4_ = fVar33 * auVar68._8_4_;
      auVar74._12_4_ = fVar33 * auVar68._12_4_;
      auVar68 = vmaxps_avx(auVar74,auVar86);
      auVar34 = vmaxps_avx(auVar34,auVar68);
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar65 ^ 0x10)),auVar105);
      auVar75._0_4_ = fVar2 * auVar68._0_4_;
      auVar75._4_4_ = fVar2 * auVar68._4_4_;
      auVar75._8_4_ = fVar2 * auVar68._8_4_;
      auVar75._12_4_ = fVar2 * auVar68._12_4_;
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar67 ^ 0x10)),auVar109);
      auVar79._0_4_ = fVar3 * auVar68._0_4_;
      auVar79._4_4_ = fVar3 * auVar68._4_4_;
      auVar79._8_4_ = fVar3 * auVar68._8_4_;
      auVar79._12_4_ = fVar3 * auVar68._12_4_;
      auVar68 = vminps_avx(auVar75,auVar79);
      auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + (uVar66 ^ 0x10)),auVar113);
      auVar80._0_4_ = fVar4 * auVar73._0_4_;
      auVar80._4_4_ = fVar4 * auVar73._4_4_;
      auVar80._8_4_ = fVar4 * auVar73._8_4_;
      auVar80._12_4_ = fVar4 * auVar73._12_4_;
      auVar73 = vminps_avx(auVar80,auVar91);
      auVar68 = vminps_avx(auVar68,auVar73);
      auVar34 = vcmpps_avx(auVar34,auVar68,2);
      uVar58 = vmovmskps_avx(auVar34);
      if (uVar58 == 0) goto LAB_01605aba;
      uVar58 = uVar58 & 0xff;
      uVar59 = uVar61 & 0xfffffffffffffff0;
      lVar38 = 0;
      for (uVar61 = (ulong)uVar58; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar61 = *(ulong *)(uVar59 + lVar38 * 8);
      uVar58 = uVar58 - 1 & uVar58;
      uVar63 = (ulong)uVar58;
      if (uVar58 != 0) {
        do {
          *local_e78 = uVar61;
          local_e78 = local_e78 + 1;
          lVar38 = 0;
          for (uVar61 = uVar63; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar63 = uVar63 - 1 & uVar63;
          uVar61 = *(ulong *)(uVar59 + lVar38 * 8);
        } while (uVar63 != 0);
      }
    }
    uVar59 = uVar61 & 0xfffffffffffffff0;
    for (local_c80 = 0; local_c80 != (ulong)((uint)uVar61 & 0xf) - 8; local_c80 = local_c80 + 1) {
      lVar60 = local_c80 * 0xe0;
      lVar38 = uVar59 + 0xd0 + lVar60;
      local_b20 = *(undefined8 *)(lVar38 + 0x10);
      uStack_b18 = *(undefined8 *)(lVar38 + 0x18);
      lVar38 = uVar59 + 0xc0 + lVar60;
      local_b00 = *(undefined8 *)(lVar38 + 0x10);
      uStack_af8 = *(undefined8 *)(lVar38 + 0x18);
      uStack_af0 = local_b00;
      uStack_ae8 = uStack_af8;
      uStack_b10 = local_b20;
      uStack_b08 = uStack_b18;
      auVar87._16_16_ = *(undefined1 (*) [16])(uVar59 + 0x60 + lVar60);
      auVar87._0_16_ = *(undefined1 (*) [16])(uVar59 + lVar60);
      auVar77._16_16_ = *(undefined1 (*) [16])(uVar59 + 0x70 + lVar60);
      auVar77._0_16_ = *(undefined1 (*) [16])(uVar59 + 0x10 + lVar60);
      auVar104._16_16_ = *(undefined1 (*) [16])(uVar59 + 0x80 + lVar60);
      auVar104._0_16_ = *(undefined1 (*) [16])(uVar59 + 0x20 + lVar60);
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0x30 + lVar60);
      auVar110._16_16_ = auVar34;
      auVar110._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0x40 + lVar60);
      auVar92._16_16_ = auVar34;
      auVar92._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0x50 + lVar60);
      auVar96._16_16_ = auVar34;
      auVar96._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0x90 + lVar60);
      auVar106._16_16_ = auVar34;
      auVar106._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0xa0 + lVar60);
      auVar128._16_16_ = auVar34;
      auVar128._0_16_ = auVar34;
      auVar34 = *(undefined1 (*) [16])(uVar59 + 0xb0 + lVar60);
      auVar71._16_16_ = auVar34;
      auVar71._0_16_ = auVar34;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar123._4_4_ = uVar1;
      auVar123._0_4_ = uVar1;
      auVar123._8_4_ = uVar1;
      auVar123._12_4_ = uVar1;
      auVar123._16_4_ = uVar1;
      auVar123._20_4_ = uVar1;
      auVar123._24_4_ = uVar1;
      auVar123._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar125._4_4_ = uVar1;
      auVar125._0_4_ = uVar1;
      auVar125._8_4_ = uVar1;
      auVar125._12_4_ = uVar1;
      auVar125._16_4_ = uVar1;
      auVar125._20_4_ = uVar1;
      auVar125._24_4_ = uVar1;
      auVar125._28_4_ = uVar1;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar126._4_4_ = uVar5;
      auVar126._0_4_ = uVar5;
      auVar126._8_4_ = uVar5;
      auVar126._12_4_ = uVar5;
      auVar126._16_4_ = uVar5;
      auVar126._20_4_ = uVar5;
      auVar126._24_4_ = uVar5;
      auVar126._28_4_ = uVar5;
      auVar87 = vsubps_avx(auVar87,auVar123);
      auVar77 = vsubps_avx(auVar77,auVar125);
      local_c40 = vsubps_avx(auVar104,auVar126);
      auVar69 = vsubps_avx(auVar110,auVar123);
      auVar70 = vsubps_avx(auVar92,auVar125);
      auVar76 = vsubps_avx(auVar96,auVar126);
      auVar92 = vsubps_avx(auVar106,auVar123);
      auVar96 = vsubps_avx(auVar128,auVar125);
      auVar35 = vsubps_avx(auVar71,auVar126);
      auVar71 = vsubps_avx(auVar92,auVar87);
      auVar104 = vsubps_avx(auVar96,auVar77);
      auVar106 = vsubps_avx(auVar35,local_c40);
      auVar72._0_4_ = auVar87._0_4_ + auVar92._0_4_;
      auVar72._4_4_ = auVar87._4_4_ + auVar92._4_4_;
      auVar72._8_4_ = auVar87._8_4_ + auVar92._8_4_;
      auVar72._12_4_ = auVar87._12_4_ + auVar92._12_4_;
      auVar72._16_4_ = auVar87._16_4_ + auVar92._16_4_;
      auVar72._20_4_ = auVar87._20_4_ + auVar92._20_4_;
      auVar72._24_4_ = auVar87._24_4_ + auVar92._24_4_;
      auVar72._28_4_ = auVar87._28_4_ + auVar92._28_4_;
      auVar107._0_4_ = auVar96._0_4_ + auVar77._0_4_;
      auVar107._4_4_ = auVar96._4_4_ + auVar77._4_4_;
      auVar107._8_4_ = auVar96._8_4_ + auVar77._8_4_;
      auVar107._12_4_ = auVar96._12_4_ + auVar77._12_4_;
      auVar107._16_4_ = auVar96._16_4_ + auVar77._16_4_;
      auVar107._20_4_ = auVar96._20_4_ + auVar77._20_4_;
      auVar107._24_4_ = auVar96._24_4_ + auVar77._24_4_;
      auVar107._28_4_ = auVar96._28_4_ + auVar77._28_4_;
      fVar9 = local_c40._0_4_;
      auVar93._0_4_ = auVar35._0_4_ + fVar9;
      fVar10 = local_c40._4_4_;
      auVar93._4_4_ = auVar35._4_4_ + fVar10;
      fVar11 = local_c40._8_4_;
      auVar93._8_4_ = auVar35._8_4_ + fVar11;
      fVar12 = local_c40._12_4_;
      auVar93._12_4_ = auVar35._12_4_ + fVar12;
      fVar13 = local_c40._16_4_;
      auVar93._16_4_ = auVar35._16_4_ + fVar13;
      fVar14 = local_c40._20_4_;
      auVar93._20_4_ = auVar35._20_4_ + fVar14;
      fVar15 = local_c40._24_4_;
      auVar93._24_4_ = auVar35._24_4_ + fVar15;
      fVar116 = auVar35._28_4_;
      auVar93._28_4_ = fVar116 + local_c40._28_4_;
      auVar36._4_4_ = auVar106._4_4_ * auVar107._4_4_;
      auVar36._0_4_ = auVar106._0_4_ * auVar107._0_4_;
      auVar36._8_4_ = auVar106._8_4_ * auVar107._8_4_;
      auVar36._12_4_ = auVar106._12_4_ * auVar107._12_4_;
      auVar36._16_4_ = auVar106._16_4_ * auVar107._16_4_;
      auVar36._20_4_ = auVar106._20_4_ * auVar107._20_4_;
      auVar36._24_4_ = auVar106._24_4_ * auVar107._24_4_;
      auVar36._28_4_ = uVar1;
      auVar68 = vfmsub231ps_fma(auVar36,auVar104,auVar93);
      auVar37._4_4_ = auVar71._4_4_ * auVar93._4_4_;
      auVar37._0_4_ = auVar71._0_4_ * auVar93._0_4_;
      auVar37._8_4_ = auVar71._8_4_ * auVar93._8_4_;
      auVar37._12_4_ = auVar71._12_4_ * auVar93._12_4_;
      auVar37._16_4_ = auVar71._16_4_ * auVar93._16_4_;
      auVar37._20_4_ = auVar71._20_4_ * auVar93._20_4_;
      auVar37._24_4_ = auVar71._24_4_ * auVar93._24_4_;
      auVar37._28_4_ = auVar93._28_4_;
      auVar34 = vfmsub231ps_fma(auVar37,auVar106,auVar72);
      auVar41._4_4_ = auVar104._4_4_ * auVar72._4_4_;
      auVar41._0_4_ = auVar104._0_4_ * auVar72._0_4_;
      auVar41._8_4_ = auVar104._8_4_ * auVar72._8_4_;
      auVar41._12_4_ = auVar104._12_4_ * auVar72._12_4_;
      auVar41._16_4_ = auVar104._16_4_ * auVar72._16_4_;
      auVar41._20_4_ = auVar104._20_4_ * auVar72._20_4_;
      auVar41._24_4_ = auVar104._24_4_ * auVar72._24_4_;
      auVar41._28_4_ = auVar72._28_4_;
      auVar73 = vfmsub231ps_fma(auVar41,auVar71,auVar107);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar124._4_4_ = uVar1;
      auVar124._0_4_ = uVar1;
      auVar124._8_4_ = uVar1;
      auVar124._12_4_ = uVar1;
      auVar124._16_4_ = uVar1;
      auVar124._20_4_ = uVar1;
      auVar124._24_4_ = uVar1;
      auVar124._28_4_ = uVar1;
      fVar6 = *(float *)(ray + k * 4 + 0xc0);
      auVar42._4_4_ = fVar6 * auVar73._4_4_;
      auVar42._0_4_ = fVar6 * auVar73._0_4_;
      auVar42._8_4_ = fVar6 * auVar73._8_4_;
      auVar42._12_4_ = fVar6 * auVar73._12_4_;
      auVar42._16_4_ = fVar6 * 0.0;
      auVar42._20_4_ = fVar6 * 0.0;
      auVar42._24_4_ = fVar6 * 0.0;
      auVar42._28_4_ = fVar116;
      auVar34 = vfmadd231ps_fma(auVar42,auVar124,ZEXT1632(auVar34));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar127._4_4_ = uVar1;
      auVar127._0_4_ = uVar1;
      auVar127._8_4_ = uVar1;
      auVar127._12_4_ = uVar1;
      auVar127._16_4_ = uVar1;
      auVar127._20_4_ = uVar1;
      auVar127._24_4_ = uVar1;
      auVar127._28_4_ = uVar1;
      auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar127,ZEXT1632(auVar68));
      auVar36 = vsubps_avx(auVar77,auVar70);
      local_b40 = vsubps_avx(local_c40,auVar76);
      auVar81._0_4_ = auVar70._0_4_ + auVar77._0_4_;
      auVar81._4_4_ = auVar70._4_4_ + auVar77._4_4_;
      auVar81._8_4_ = auVar70._8_4_ + auVar77._8_4_;
      auVar81._12_4_ = auVar70._12_4_ + auVar77._12_4_;
      auVar81._16_4_ = auVar70._16_4_ + auVar77._16_4_;
      auVar81._20_4_ = auVar70._20_4_ + auVar77._20_4_;
      auVar81._24_4_ = auVar70._24_4_ + auVar77._24_4_;
      auVar81._28_4_ = auVar70._28_4_ + auVar77._28_4_;
      auVar94._0_4_ = fVar9 + auVar76._0_4_;
      auVar94._4_4_ = fVar10 + auVar76._4_4_;
      auVar94._8_4_ = fVar11 + auVar76._8_4_;
      auVar94._12_4_ = fVar12 + auVar76._12_4_;
      auVar94._16_4_ = fVar13 + auVar76._16_4_;
      auVar94._20_4_ = fVar14 + auVar76._20_4_;
      auVar94._24_4_ = fVar15 + auVar76._24_4_;
      fVar112 = auVar76._28_4_;
      auVar94._28_4_ = local_c40._28_4_ + fVar112;
      fVar98 = local_b40._0_4_;
      fVar101 = local_b40._4_4_;
      auVar43._4_4_ = auVar81._4_4_ * fVar101;
      auVar43._0_4_ = auVar81._0_4_ * fVar98;
      fVar16 = local_b40._8_4_;
      auVar43._8_4_ = auVar81._8_4_ * fVar16;
      fVar19 = local_b40._12_4_;
      auVar43._12_4_ = auVar81._12_4_ * fVar19;
      fVar22 = local_b40._16_4_;
      auVar43._16_4_ = auVar81._16_4_ * fVar22;
      fVar25 = local_b40._20_4_;
      auVar43._20_4_ = auVar81._20_4_ * fVar25;
      fVar28 = local_b40._24_4_;
      auVar43._24_4_ = auVar81._24_4_ * fVar28;
      auVar43._28_4_ = auVar107._28_4_;
      auVar73 = vfmsub231ps_fma(auVar43,auVar36,auVar94);
      local_b60 = vsubps_avx(auVar87,auVar69);
      fVar99 = local_b60._0_4_;
      fVar102 = local_b60._4_4_;
      auVar44._4_4_ = auVar94._4_4_ * fVar102;
      auVar44._0_4_ = auVar94._0_4_ * fVar99;
      fVar17 = local_b60._8_4_;
      auVar44._8_4_ = auVar94._8_4_ * fVar17;
      fVar20 = local_b60._12_4_;
      auVar44._12_4_ = auVar94._12_4_ * fVar20;
      fVar23 = local_b60._16_4_;
      auVar44._16_4_ = auVar94._16_4_ * fVar23;
      fVar26 = local_b60._20_4_;
      auVar44._20_4_ = auVar94._20_4_ * fVar26;
      fVar29 = local_b60._24_4_;
      auVar44._24_4_ = auVar94._24_4_ * fVar29;
      auVar44._28_4_ = auVar94._28_4_;
      auVar114._0_4_ = auVar87._0_4_ + auVar69._0_4_;
      auVar114._4_4_ = auVar87._4_4_ + auVar69._4_4_;
      auVar114._8_4_ = auVar87._8_4_ + auVar69._8_4_;
      auVar114._12_4_ = auVar87._12_4_ + auVar69._12_4_;
      auVar114._16_4_ = auVar87._16_4_ + auVar69._16_4_;
      auVar114._20_4_ = auVar87._20_4_ + auVar69._20_4_;
      auVar114._24_4_ = auVar87._24_4_ + auVar69._24_4_;
      auVar114._28_4_ = auVar87._28_4_ + auVar69._28_4_;
      auVar68 = vfmsub231ps_fma(auVar44,local_b40,auVar114);
      fVar100 = auVar36._0_4_;
      fVar103 = auVar36._4_4_;
      auVar45._4_4_ = auVar114._4_4_ * fVar103;
      auVar45._0_4_ = auVar114._0_4_ * fVar100;
      fVar18 = auVar36._8_4_;
      auVar45._8_4_ = auVar114._8_4_ * fVar18;
      fVar21 = auVar36._12_4_;
      auVar45._12_4_ = auVar114._12_4_ * fVar21;
      fVar24 = auVar36._16_4_;
      auVar45._16_4_ = auVar114._16_4_ * fVar24;
      fVar27 = auVar36._20_4_;
      auVar45._20_4_ = auVar114._20_4_ * fVar27;
      fVar30 = auVar36._24_4_;
      auVar45._24_4_ = auVar114._24_4_ * fVar30;
      auVar45._28_4_ = auVar114._28_4_;
      auVar74 = vfmsub231ps_fma(auVar45,local_b60,auVar81);
      auVar115._0_4_ = auVar74._0_4_ * fVar6;
      auVar115._4_4_ = auVar74._4_4_ * fVar6;
      auVar115._8_4_ = auVar74._8_4_ * fVar6;
      auVar115._12_4_ = auVar74._12_4_ * fVar6;
      auVar115._16_4_ = fVar6 * 0.0;
      auVar115._20_4_ = fVar6 * 0.0;
      auVar115._24_4_ = fVar6 * 0.0;
      auVar115._28_4_ = 0;
      auVar68 = vfmadd231ps_fma(auVar115,auVar124,ZEXT1632(auVar68));
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar127,ZEXT1632(auVar73));
      auVar37 = vsubps_avx(auVar69,auVar92);
      auVar88._0_4_ = auVar69._0_4_ + auVar92._0_4_;
      auVar88._4_4_ = auVar69._4_4_ + auVar92._4_4_;
      auVar88._8_4_ = auVar69._8_4_ + auVar92._8_4_;
      auVar88._12_4_ = auVar69._12_4_ + auVar92._12_4_;
      auVar88._16_4_ = auVar69._16_4_ + auVar92._16_4_;
      auVar88._20_4_ = auVar69._20_4_ + auVar92._20_4_;
      auVar88._24_4_ = auVar69._24_4_ + auVar92._24_4_;
      auVar88._28_4_ = auVar69._28_4_ + auVar92._28_4_;
      auVar92 = vsubps_avx(auVar70,auVar96);
      auVar97._0_4_ = auVar70._0_4_ + auVar96._0_4_;
      auVar97._4_4_ = auVar70._4_4_ + auVar96._4_4_;
      auVar97._8_4_ = auVar70._8_4_ + auVar96._8_4_;
      auVar97._12_4_ = auVar70._12_4_ + auVar96._12_4_;
      auVar97._16_4_ = auVar70._16_4_ + auVar96._16_4_;
      auVar97._20_4_ = auVar70._20_4_ + auVar96._20_4_;
      auVar97._24_4_ = auVar70._24_4_ + auVar96._24_4_;
      auVar97._28_4_ = auVar70._28_4_ + auVar96._28_4_;
      auVar96 = vsubps_avx(auVar76,auVar35);
      auVar82._0_4_ = auVar76._0_4_ + auVar35._0_4_;
      auVar82._4_4_ = auVar76._4_4_ + auVar35._4_4_;
      auVar82._8_4_ = auVar76._8_4_ + auVar35._8_4_;
      auVar82._12_4_ = auVar76._12_4_ + auVar35._12_4_;
      auVar82._16_4_ = auVar76._16_4_ + auVar35._16_4_;
      auVar82._20_4_ = auVar76._20_4_ + auVar35._20_4_;
      auVar82._24_4_ = auVar76._24_4_ + auVar35._24_4_;
      auVar82._28_4_ = fVar112 + fVar116;
      auVar35._4_4_ = auVar96._4_4_ * auVar97._4_4_;
      auVar35._0_4_ = auVar96._0_4_ * auVar97._0_4_;
      auVar35._8_4_ = auVar96._8_4_ * auVar97._8_4_;
      auVar35._12_4_ = auVar96._12_4_ * auVar97._12_4_;
      auVar35._16_4_ = auVar96._16_4_ * auVar97._16_4_;
      auVar35._20_4_ = auVar96._20_4_ * auVar97._20_4_;
      auVar35._24_4_ = auVar96._24_4_ * auVar97._24_4_;
      auVar35._28_4_ = fVar112;
      auVar74 = vfmsub231ps_fma(auVar35,auVar92,auVar82);
      auVar46._4_4_ = auVar82._4_4_ * auVar37._4_4_;
      auVar46._0_4_ = auVar82._0_4_ * auVar37._0_4_;
      auVar46._8_4_ = auVar82._8_4_ * auVar37._8_4_;
      auVar46._12_4_ = auVar82._12_4_ * auVar37._12_4_;
      auVar46._16_4_ = auVar82._16_4_ * auVar37._16_4_;
      auVar46._20_4_ = auVar82._20_4_ * auVar37._20_4_;
      auVar46._24_4_ = auVar82._24_4_ * auVar37._24_4_;
      auVar46._28_4_ = auVar82._28_4_;
      auVar73 = vfmsub231ps_fma(auVar46,auVar96,auVar88);
      auVar47._4_4_ = auVar92._4_4_ * auVar88._4_4_;
      auVar47._0_4_ = auVar92._0_4_ * auVar88._0_4_;
      auVar47._8_4_ = auVar92._8_4_ * auVar88._8_4_;
      auVar47._12_4_ = auVar92._12_4_ * auVar88._12_4_;
      auVar47._16_4_ = auVar92._16_4_ * auVar88._16_4_;
      auVar47._20_4_ = auVar92._20_4_ * auVar88._20_4_;
      auVar47._24_4_ = auVar92._24_4_ * auVar88._24_4_;
      auVar47._28_4_ = auVar88._28_4_;
      auVar75 = vfmsub231ps_fma(auVar47,auVar37,auVar97);
      auVar89._0_4_ = fVar6 * auVar75._0_4_;
      auVar89._4_4_ = fVar6 * auVar75._4_4_;
      auVar89._8_4_ = fVar6 * auVar75._8_4_;
      auVar89._12_4_ = fVar6 * auVar75._12_4_;
      auVar89._16_4_ = fVar6 * 0.0;
      auVar89._20_4_ = fVar6 * 0.0;
      auVar89._24_4_ = fVar6 * 0.0;
      auVar89._28_4_ = 0;
      auVar73 = vfmadd231ps_fma(auVar89,auVar124,ZEXT1632(auVar73));
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar127,ZEXT1632(auVar74));
      local_ac0 = ZEXT1632(auVar68);
      local_ae0 = auVar34._0_4_;
      fStack_adc = auVar34._4_4_;
      fStack_ad8 = auVar34._8_4_;
      fStack_ad4 = auVar34._12_4_;
      local_aa0 = ZEXT1632(CONCAT412(auVar73._12_4_ + auVar68._12_4_ + fStack_ad4,
                                     CONCAT48(auVar73._8_4_ + auVar68._8_4_ + fStack_ad8,
                                              CONCAT44(auVar73._4_4_ + auVar68._4_4_ + fStack_adc,
                                                       auVar73._0_4_ + auVar68._0_4_ + local_ae0))))
      ;
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83._16_4_ = 0x7fffffff;
      auVar83._20_4_ = 0x7fffffff;
      auVar83._24_4_ = 0x7fffffff;
      auVar83._28_4_ = 0x7fffffff;
      auVar69 = vminps_avx(ZEXT1632(auVar34),local_ac0);
      auVar69 = vminps_avx(auVar69,ZEXT1632(auVar73));
      local_ba0 = vandps_avx(local_aa0,auVar83);
      fVar112 = local_ba0._0_4_ * 1.1920929e-07;
      fVar116 = local_ba0._4_4_ * 1.1920929e-07;
      auVar48._4_4_ = fVar116;
      auVar48._0_4_ = fVar112;
      fVar117 = local_ba0._8_4_ * 1.1920929e-07;
      auVar48._8_4_ = fVar117;
      fVar118 = local_ba0._12_4_ * 1.1920929e-07;
      auVar48._12_4_ = fVar118;
      fVar119 = local_ba0._16_4_ * 1.1920929e-07;
      auVar48._16_4_ = fVar119;
      fVar120 = local_ba0._20_4_ * 1.1920929e-07;
      auVar48._20_4_ = fVar120;
      fVar121 = local_ba0._24_4_ * 1.1920929e-07;
      auVar48._24_4_ = fVar121;
      auVar48._28_4_ = 0x34000000;
      auVar108._0_8_ = CONCAT44(fVar116,fVar112) ^ 0x8000000080000000;
      auVar108._8_4_ = -fVar117;
      auVar108._12_4_ = -fVar118;
      auVar108._16_4_ = -fVar119;
      auVar108._20_4_ = -fVar120;
      auVar108._24_4_ = -fVar121;
      auVar108._28_4_ = 0xb4000000;
      auVar69 = vcmpps_avx(auVar69,auVar108,5);
      local_b80 = ZEXT1632(auVar34);
      auVar76 = vmaxps_avx(local_b80,local_ac0);
      auVar70 = vmaxps_avx(auVar76,ZEXT1632(auVar73));
      auVar70 = vcmpps_avx(auVar70,auVar48,2);
      auVar70 = vorps_avx(auVar69,auVar70);
      if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0x7f,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar70 >> 0xbf,0) != '\0') ||
          (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar70[0x1f] < '\0') {
        auVar49._4_4_ = fVar103 * auVar106._4_4_;
        auVar49._0_4_ = fVar100 * auVar106._0_4_;
        auVar49._8_4_ = fVar18 * auVar106._8_4_;
        auVar49._12_4_ = fVar21 * auVar106._12_4_;
        auVar49._16_4_ = fVar24 * auVar106._16_4_;
        auVar49._20_4_ = fVar27 * auVar106._20_4_;
        auVar49._24_4_ = fVar30 * auVar106._24_4_;
        auVar49._28_4_ = auVar69._28_4_;
        auVar50._4_4_ = fVar102 * auVar104._4_4_;
        auVar50._0_4_ = fVar99 * auVar104._0_4_;
        auVar50._8_4_ = fVar17 * auVar104._8_4_;
        auVar50._12_4_ = fVar20 * auVar104._12_4_;
        auVar50._16_4_ = fVar23 * auVar104._16_4_;
        auVar50._20_4_ = fVar26 * auVar104._20_4_;
        auVar50._24_4_ = fVar29 * auVar104._24_4_;
        auVar50._28_4_ = 0x34000000;
        auVar34 = vfmsub213ps_fma(auVar104,local_b40,auVar49);
        auVar51._4_4_ = auVar92._4_4_ * fVar101;
        auVar51._0_4_ = auVar92._0_4_ * fVar98;
        auVar51._8_4_ = auVar92._8_4_ * fVar16;
        auVar51._12_4_ = auVar92._12_4_ * fVar19;
        auVar51._16_4_ = auVar92._16_4_ * fVar22;
        auVar51._20_4_ = auVar92._20_4_ * fVar25;
        auVar51._24_4_ = auVar92._24_4_ * fVar28;
        auVar51._28_4_ = auVar76._28_4_;
        auVar52._4_4_ = fVar102 * auVar96._4_4_;
        auVar52._0_4_ = fVar99 * auVar96._0_4_;
        auVar52._8_4_ = fVar17 * auVar96._8_4_;
        auVar52._12_4_ = fVar20 * auVar96._12_4_;
        auVar52._16_4_ = fVar23 * auVar96._16_4_;
        auVar52._20_4_ = fVar26 * auVar96._20_4_;
        auVar52._24_4_ = fVar29 * auVar96._24_4_;
        auVar52._28_4_ = local_ba0._28_4_;
        auVar73 = vfmsub213ps_fma(auVar96,auVar36,auVar51);
        auVar69 = vandps_avx(auVar49,auVar83);
        auVar76 = vandps_avx(auVar51,auVar83);
        auVar69 = vcmpps_avx(auVar69,auVar76,1);
        local_a80 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar34),auVar69);
        auVar53._4_4_ = fVar103 * auVar37._4_4_;
        auVar53._0_4_ = fVar100 * auVar37._0_4_;
        auVar53._8_4_ = fVar18 * auVar37._8_4_;
        auVar53._12_4_ = fVar21 * auVar37._12_4_;
        auVar53._16_4_ = fVar24 * auVar37._16_4_;
        auVar53._20_4_ = fVar27 * auVar37._20_4_;
        auVar53._24_4_ = fVar30 * auVar37._24_4_;
        auVar53._28_4_ = auVar69._28_4_;
        auVar34 = vfmsub213ps_fma(auVar37,local_b40,auVar52);
        auVar54._4_4_ = auVar71._4_4_ * fVar101;
        auVar54._0_4_ = auVar71._0_4_ * fVar98;
        auVar54._8_4_ = auVar71._8_4_ * fVar16;
        auVar54._12_4_ = auVar71._12_4_ * fVar19;
        auVar54._16_4_ = auVar71._16_4_ * fVar22;
        auVar54._20_4_ = auVar71._20_4_ * fVar25;
        auVar54._24_4_ = auVar71._24_4_ * fVar28;
        auVar54._28_4_ = auVar76._28_4_;
        auVar73 = vfmsub213ps_fma(auVar106,local_b60,auVar54);
        auVar69 = vandps_avx(auVar54,auVar83);
        auVar76 = vandps_avx(auVar52,auVar83);
        auVar69 = vcmpps_avx(auVar69,auVar76,1);
        local_a60 = vblendvps_avx(ZEXT1632(auVar34),ZEXT1632(auVar73),auVar69);
        auVar34 = vfmsub213ps_fma(auVar71,auVar36,auVar50);
        auVar73 = vfmsub213ps_fma(auVar92,local_b60,auVar53);
        auVar69 = vandps_avx(auVar50,auVar83);
        auVar76 = vandps_avx(auVar53,auVar83);
        auVar69 = vcmpps_avx(auVar69,auVar76,1);
        local_a40 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar34),auVar69);
        auVar34 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
        fVar112 = local_a40._0_4_;
        auVar84._0_4_ = fVar112 * fVar6;
        fVar98 = local_a40._4_4_;
        auVar84._4_4_ = fVar98 * fVar6;
        fVar99 = local_a40._8_4_;
        auVar84._8_4_ = fVar99 * fVar6;
        fVar100 = local_a40._12_4_;
        auVar84._12_4_ = fVar100 * fVar6;
        fVar101 = local_a40._16_4_;
        auVar84._16_4_ = fVar101 * fVar6;
        fVar102 = local_a40._20_4_;
        auVar84._20_4_ = fVar102 * fVar6;
        fVar103 = local_a40._24_4_;
        auVar84._24_4_ = fVar103 * fVar6;
        auVar84._28_4_ = 0;
        auVar73 = vfmadd213ps_fma(auVar124,local_a60,auVar84);
        auVar73 = vfmadd213ps_fma(auVar127,local_a80,ZEXT1632(auVar73));
        auVar76 = ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                     CONCAT48(auVar73._8_4_ + auVar73._8_4_,
                                              CONCAT44(auVar73._4_4_ + auVar73._4_4_,
                                                       auVar73._0_4_ + auVar73._0_4_))));
        auVar55._4_4_ = fVar98 * fVar10;
        auVar55._0_4_ = fVar112 * fVar9;
        auVar55._8_4_ = fVar99 * fVar11;
        auVar55._12_4_ = fVar100 * fVar12;
        auVar55._16_4_ = fVar101 * fVar13;
        auVar55._20_4_ = fVar102 * fVar14;
        auVar55._24_4_ = fVar103 * fVar15;
        auVar55._28_4_ = auVar70._28_4_;
        auVar73 = vfmadd213ps_fma(auVar77,local_a60,auVar55);
        auVar74 = vfmadd213ps_fma(auVar87,local_a80,ZEXT1632(auVar73));
        auVar69 = vrcpps_avx(auVar76);
        auVar122._8_4_ = 0x3f800000;
        auVar122._0_8_ = 0x3f8000003f800000;
        auVar122._12_4_ = 0x3f800000;
        auVar122._16_4_ = 0x3f800000;
        auVar122._20_4_ = 0x3f800000;
        auVar122._24_4_ = 0x3f800000;
        auVar122._28_4_ = 0x3f800000;
        auVar73 = vfnmadd213ps_fma(auVar69,auVar76,auVar122);
        auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar69,auVar69);
        local_9c0 = ZEXT1632(CONCAT412(auVar73._12_4_ * (auVar74._12_4_ + auVar74._12_4_),
                                       CONCAT48(auVar73._8_4_ * (auVar74._8_4_ + auVar74._8_4_),
                                                CONCAT44(auVar73._4_4_ *
                                                         (auVar74._4_4_ + auVar74._4_4_),
                                                         auVar73._0_4_ *
                                                         (auVar74._0_4_ + auVar74._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar111._4_4_ = uVar1;
        auVar111._0_4_ = uVar1;
        auVar111._8_4_ = uVar1;
        auVar111._12_4_ = uVar1;
        auVar111._16_4_ = uVar1;
        auVar111._20_4_ = uVar1;
        auVar111._24_4_ = uVar1;
        auVar111._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        local_c60._4_4_ = uVar1;
        local_c60._0_4_ = uVar1;
        local_c60._8_4_ = uVar1;
        local_c60._12_4_ = uVar1;
        local_c60._16_4_ = uVar1;
        local_c60._20_4_ = uVar1;
        local_c60._24_4_ = uVar1;
        local_c60._28_4_ = uVar1;
        auVar69 = vcmpps_avx(auVar111,local_9c0,2);
        auVar70 = vcmpps_avx(local_9c0,local_c60,2);
        auVar69 = vandps_avx(auVar69,auVar70);
        auVar73 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
        auVar34 = vpand_avx(auVar73,auVar34);
        auVar69 = vpmovsxwd_avx2(auVar34);
        if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar69 >> 0x7f,0) != '\0') ||
              (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar69 >> 0xbf,0) != '\0') ||
            (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar69[0x1f] < '\0') {
          auVar69 = vcmpps_avx(auVar76,_DAT_01f7b000,4);
          auVar73 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
          auVar34 = vpand_avx(auVar34,auVar73);
          local_a20 = vpmovsxwd_avx2(auVar34);
          if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a20 >> 0x7f,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_a20 >> 0xbf,0) != '\0') ||
              (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_a20[0x1f] < '\0') {
            auStack_c78 = auVar106._8_24_;
            uStack_ad0 = 0;
            uStack_acc = 0;
            uStack_ac8 = 0;
            uStack_ac4 = 0;
            local_940 = local_bc0;
            auVar69 = vrcpps_avx(local_aa0);
            auVar95._8_4_ = 0x3f800000;
            auVar95._0_8_ = 0x3f8000003f800000;
            auVar95._12_4_ = 0x3f800000;
            auVar95._16_4_ = 0x3f800000;
            auVar95._20_4_ = 0x3f800000;
            auVar95._24_4_ = 0x3f800000;
            auVar95._28_4_ = 0x3f800000;
            auVar73 = vfnmadd213ps_fma(local_aa0,auVar69,auVar95);
            auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar69,auVar69);
            auVar90._8_4_ = 0x219392ef;
            auVar90._0_8_ = 0x219392ef219392ef;
            auVar90._12_4_ = 0x219392ef;
            auVar90._16_4_ = 0x219392ef;
            auVar90._20_4_ = 0x219392ef;
            auVar90._24_4_ = 0x219392ef;
            auVar90._28_4_ = 0x219392ef;
            auVar69 = vcmpps_avx(local_ba0,auVar90,5);
            auVar69 = vandps_avx(auVar69,ZEXT1632(auVar73));
            auVar56._4_4_ = fStack_adc * auVar69._4_4_;
            auVar56._0_4_ = local_ae0 * auVar69._0_4_;
            auVar56._8_4_ = fStack_ad8 * auVar69._8_4_;
            auVar56._12_4_ = fStack_ad4 * auVar69._12_4_;
            auVar56._16_4_ = auVar69._16_4_ * 0.0;
            auVar56._20_4_ = auVar69._20_4_ * 0.0;
            auVar56._24_4_ = auVar69._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar70 = vminps_avx(auVar56,auVar95);
            auVar78._0_4_ = auVar68._0_4_ * auVar69._0_4_;
            auVar78._4_4_ = auVar68._4_4_ * auVar69._4_4_;
            auVar78._8_4_ = auVar68._8_4_ * auVar69._8_4_;
            auVar78._12_4_ = auVar68._12_4_ * auVar69._12_4_;
            auVar78._16_4_ = auVar69._16_4_ * 0.0;
            auVar78._20_4_ = auVar69._20_4_ * 0.0;
            auVar78._24_4_ = auVar69._24_4_ * 0.0;
            auVar78._28_4_ = 0;
            auVar69 = vminps_avx(auVar78,auVar95);
            auVar76 = vsubps_avx(auVar95,auVar70);
            auVar77 = vsubps_avx(auVar95,auVar69);
            local_9e0 = vblendvps_avx(auVar69,auVar76,local_bc0);
            local_a00 = vblendvps_avx(auVar70,auVar77,local_bc0);
            local_980._4_4_ = (float)local_be0._4_4_ * local_a60._4_4_;
            local_980._0_4_ = (float)local_be0._0_4_ * local_a60._0_4_;
            local_980._8_4_ = fStack_bd8 * local_a60._8_4_;
            local_980._12_4_ = fStack_bd4 * local_a60._12_4_;
            local_980._16_4_ = fStack_bd0 * local_a60._16_4_;
            local_980._20_4_ = fStack_bcc * local_a60._20_4_;
            local_980._24_4_ = fStack_bc8 * local_a60._24_4_;
            local_980._28_4_ = local_9e0._28_4_;
            local_9a0[0] = local_a80._0_4_ * (float)local_be0._0_4_;
            local_9a0[1] = local_a80._4_4_ * (float)local_be0._4_4_;
            local_9a0[2] = local_a80._8_4_ * fStack_bd8;
            local_9a0[3] = local_a80._12_4_ * fStack_bd4;
            fStack_990 = local_a80._16_4_ * fStack_bd0;
            fStack_98c = local_a80._20_4_ * fStack_bcc;
            fStack_988 = local_a80._24_4_ * fStack_bc8;
            uStack_984 = local_a00._28_4_;
            local_960[0] = (float)local_be0._0_4_ * fVar112;
            local_960[1] = (float)local_be0._4_4_ * fVar98;
            local_960[2] = fStack_bd8 * fVar99;
            local_960[3] = fStack_bd4 * fVar100;
            fStack_950 = fStack_bd0 * fVar101;
            fStack_94c = fStack_bcc * fVar102;
            fStack_948 = fStack_bc8 * fVar103;
            uStack_944 = uStack_bc4;
            auVar34 = vpacksswb_avx(auVar34,auVar34);
            uVar63 = (ulong)(byte)(SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar34 >> 0x3f,0) << 7);
            auStack_c98 = auVar87._8_24_;
            local_ca0 = context->scene;
            pSVar62 = context->scene;
            do {
              uVar39 = 0;
              for (uVar40 = uVar63; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                uVar39 = uVar39 + 1;
              }
              uVar58 = *(uint *)((long)&local_b00 + uVar39 * 4);
              pGVar7 = (pSVar62->geometries).items[uVar58].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_c40._0_8_ = uVar63;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar63 = (ulong)(uint)((int)uVar39 * 4);
                  local_8c0 = *(undefined4 *)(local_a00 + uVar63);
                  local_8a0 = *(undefined4 *)(local_9e0 + uVar63);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9c0 + uVar63);
                  local_cd0.context = context->user;
                  local_880 = *(undefined4 *)((long)&local_b20 + uVar63);
                  local_920 = *(undefined4 *)((long)local_9a0 + uVar63);
                  uVar1 = *(undefined4 *)(local_980 + uVar63);
                  local_900._4_4_ = uVar1;
                  local_900._0_4_ = uVar1;
                  local_900._8_4_ = uVar1;
                  local_900._12_4_ = uVar1;
                  local_900._16_4_ = uVar1;
                  local_900._20_4_ = uVar1;
                  local_900._24_4_ = uVar1;
                  local_900._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)local_960 + uVar63);
                  local_8e0._4_4_ = uVar1;
                  local_8e0._0_4_ = uVar1;
                  local_8e0._8_4_ = uVar1;
                  local_8e0._12_4_ = uVar1;
                  local_8e0._16_4_ = uVar1;
                  local_8e0._20_4_ = uVar1;
                  local_8e0._24_4_ = uVar1;
                  local_8e0._28_4_ = uVar1;
                  local_860._4_4_ = uVar58;
                  local_860._0_4_ = uVar58;
                  local_860._8_4_ = uVar58;
                  local_860._12_4_ = uVar58;
                  local_860._16_4_ = uVar58;
                  local_860._20_4_ = uVar58;
                  local_860._24_4_ = uVar58;
                  local_860._28_4_ = uVar58;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  uStack_87c = local_880;
                  uStack_878 = local_880;
                  uStack_874 = local_880;
                  uStack_870 = local_880;
                  uStack_86c = local_880;
                  uStack_868 = local_880;
                  uStack_864 = local_880;
                  auVar69 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_cd0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_cd0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c20 = local_c00;
                  local_cd0.valid = (int *)local_c20;
                  local_cd0.geometryUserPtr = pGVar7->userPtr;
                  local_cd0.hit = (RTCHitN *)&local_920;
                  local_cd0.N = 8;
                  local_cd0.ray = (RTCRayN *)ray;
                  if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar69 = ZEXT1632(auVar69._0_16_);
                    (*pGVar7->occlusionFilterN)(&local_cd0);
                    auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
                  }
                  auVar76 = vpcmpeqd_avx2(local_c20,_DAT_01f7b000);
                  auVar70 = auVar69 & ~auVar76;
                  if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar70 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar70 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar70 >> 0x7f,0) == '\0') &&
                        (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar70 >> 0xbf,0) == '\0') &&
                      (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar70[0x1f]) {
                    auVar76 = auVar76 ^ auVar69;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar69 = ZEXT1632(auVar69._0_16_);
                      (*p_Var8)(&local_cd0);
                      auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
                    }
                    auVar70 = vpcmpeqd_avx2(local_c20,_DAT_01f7b000);
                    auVar76 = auVar70 ^ auVar69;
                    auVar85._8_4_ = 0xff800000;
                    auVar85._0_8_ = 0xff800000ff800000;
                    auVar85._12_4_ = 0xff800000;
                    auVar85._16_4_ = 0xff800000;
                    auVar85._20_4_ = 0xff800000;
                    auVar85._24_4_ = 0xff800000;
                    auVar85._28_4_ = 0xff800000;
                    auVar69 = vblendvps_avx(auVar85,*(undefined1 (*) [32])(local_cd0.ray + 0x100),
                                            auVar70);
                    *(undefined1 (*) [32])(local_cd0.ray + 0x100) = auVar69;
                  }
                  if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar76 >> 0x7f,0) == '\0') &&
                        (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar76 >> 0xbf,0) == '\0') &&
                      (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar76[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = local_c60._0_4_;
                    uVar63 = local_c40._0_8_ ^ 1L << (uVar39 & 0x3f);
                    goto LAB_016063fc;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016065d2;
              }
              uVar63 = uVar63 ^ 1L << (uVar39 & 0x3f);
LAB_016063fc:
              pSVar62 = local_ca0;
            } while (uVar63 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }